

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O0

OperatorResultType
ThrottlingSum::Function
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  byte bVar1;
  int iVar2;
  idx_t iVar3;
  reference this;
  LogicalType *this_00;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  DataChunk *in_RCX;
  DataChunk *in_RDX;
  ExecutionContext *in_RDI;
  idx_t i;
  unsigned_long to_emit;
  idx_t col_idx;
  int sum;
  idx_t row_idx;
  ThrottlingSumLocalData *local_state;
  size_type in_stack_fffffffffffffe58;
  LocalTableFunctionState *in_stack_fffffffffffffe60;
  DataChunk *pDVar7;
  value_type_conflict5 *in_stack_fffffffffffffe68;
  Value *pVVar8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe70;
  Value local_138 [64];
  Value *local_f8;
  Value *local_f0;
  Value local_e8 [64];
  Value local_a8 [80];
  LogicalType local_58 [24];
  ulong local_40;
  int local_34;
  ulong local_30;
  ThrottlingSumLocalData *local_28;
  DataChunk *local_20;
  DataChunk *local_18;
  ExecutionContext *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  duckdb::optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)in_stack_fffffffffffffe60);
  local_28 = duckdb::LocalTableFunctionState::Cast<ThrottlingSum::ThrottlingSumLocalData>
                       (in_stack_fffffffffffffe60);
  for (local_30 = 0; uVar4 = local_30, iVar3 = duckdb::DataChunk::size(local_18), uVar4 < iVar3;
      local_30 = local_30 + 1) {
    local_34 = 0;
    for (local_40 = 0; uVar4 = local_40,
        iVar3 = duckdb::DataChunk::ColumnCount((DataChunk *)0x742b80), uVar4 < iVar3;
        local_40 = local_40 + 1) {
      this = duckdb::vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe58);
      this_00 = duckdb::Vector::GetType(this);
      duckdb::LogicalType::LogicalType(local_58,INTEGER);
      bVar1 = duckdb::LogicalType::operator==(this_00,local_58);
      duckdb::LogicalType::~LogicalType(local_58);
      if ((bVar1 & 1) != 0) {
        duckdb::vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58);
        duckdb::Vector::GetValue((ulong)local_a8);
        iVar2 = duckdb::Value::GetValue<int>();
        local_34 = iVar2 + local_34;
        duckdb::Value::~Value(local_a8);
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  uVar4 = duckdb::PhysicalOperator::OperatorCachingAllowed(local_8);
  if ((uVar4 & 1) == 0) {
    sVar5 = Catch::clara::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&local_28->row_sums);
    local_f0 = (Value *)(sVar5 - local_28->current_idx);
    for (local_f8 = (Value *)0x0; local_f8 < local_f0; local_f8 = local_f8 + 1) {
      pDVar7 = local_20;
      pVVar8 = local_f8;
      pvVar6 = duckdb::vector<int,_true>::operator[]
                         ((vector<int,_true> *)local_20,in_stack_fffffffffffffe58);
      duckdb::Value::Value(local_138,*pvVar6);
      duckdb::DataChunk::SetValue((ulong)pDVar7,0,pVVar8);
      duckdb::Value::~Value(local_138);
    }
    local_28->current_idx = (idx_t)(local_f0 + local_28->current_idx);
    duckdb::DataChunk::SetCardinality(local_20,(idx_t)local_f0);
  }
  else {
    uVar4 = local_28->current_idx;
    sVar5 = Catch::clara::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&local_28->row_sums);
    if (uVar4 < sVar5) {
      duckdb::DataChunk::SetCardinality(local_20,1);
      local_28->current_idx = local_28->current_idx + 1;
      pvVar6 = duckdb::vector<int,_true>::operator[]
                         ((vector<int,_true> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      duckdb::Value::Value(local_e8,*pvVar6);
      duckdb::DataChunk::SetValue((ulong)local_20,0,(Value *)0x0);
      duckdb::Value::~Value(local_e8);
    }
    else {
      duckdb::DataChunk::SetCardinality(local_20,0);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

static OperatorResultType Function(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
	                                   DataChunk &output) {
		auto &local_state = data_p.local_state->Cast<ThrottlingSum::ThrottlingSumLocalData>();

		for (idx_t row_idx = 0; row_idx < input.size(); row_idx++) {
			int sum = 0;
			for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
				if (input.data[col_idx].GetType() == LogicalType::INTEGER) {
					sum += input.data[col_idx].GetValue(row_idx).GetValue<int>();
				}
			}
			local_state.row_sums.push_back(sum);
		}

		if (PhysicalOperator::OperatorCachingAllowed(context)) {
			// Caching is allowed
			if (local_state.current_idx < local_state.row_sums.size()) {
				output.SetCardinality(1);
				output.SetValue(0, 0, Value(local_state.row_sums[local_state.current_idx++]));
			} else {
				output.SetCardinality(0);
			}
		} else {
			// Caching is not allowed, we should emit everything!
			auto to_emit = local_state.row_sums.size() - local_state.current_idx;
			for (idx_t i = 0; i < to_emit; i++) {
				output.SetValue(0, i, Value(local_state.row_sums[local_state.current_idx + i]));
			}
			local_state.current_idx += to_emit;
			output.SetCardinality(to_emit);
		}

		return OperatorResultType::NEED_MORE_INPUT;
	}